

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_flow_vault(wchar_t nearness)

{
  uint8_t uVar1;
  short sVar2;
  short sVar3;
  chunk_conflict *c;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  loc grid2;
  loc_conflict grid;
  uint8_t feat;
  borg_grid *ag;
  _Bool can_dig_hard;
  wchar_t b_x;
  wchar_t b_y;
  wchar_t i;
  wchar_t x;
  wchar_t y;
  wchar_t nearness_local;
  
  borg_temp_n = 0;
  if (vault_on_level) {
    _Var4 = borg_can_dig(false,'\x12');
    if (_Var4) {
      _Var4 = borg_can_dig(false,'\x15');
      for (i = w_y; i < w_y + ((Term->hgt - row_top_map[Term->sidebar_mode]) -
                              row_bottom_map[Term->sidebar_mode]) / (int)(uint)tile_height;
          i = i + L'\x01') {
        for (b_y = w_x;
            b_y < w_x + ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
            b_y = b_y + L'\x01') {
          grid2 = loc(b_y,i);
          wVar6 = distance(borg.c,grid2);
          if ((wVar6 <= nearness) &&
             (((((uVar1 = borg_grids[i][b_y].feat, uVar1 == '\x10' || (uVar1 == '\x12')) ||
                (uVar1 == '\x11')) || ((uVar1 == '\x14' || (uVar1 == '\x13')))) ||
              ((_Var4 && (uVar1 == '\x15')))))) {
            for (b_x = L'\0'; c = cave, b_x < L'\b'; b_x = b_x + L'\x01') {
              sVar2 = ddx_ddd[b_x];
              sVar3 = ddy_ddd[b_x];
              grid = (loc_conflict)loc(b_y + sVar2,i + sVar3);
              _Var5 = square_in_bounds_fully((chunk *)c,grid);
              if ((_Var5) && (borg_grids[i + sVar3][b_y + sVar2].feat == '\x16')) {
                borg_temp_y[borg_temp_n] = (uint8_t)i;
                borg_temp_x[borg_temp_n] = (uint8_t)b_y;
                borg_temp_n = borg_temp_n + 1;
              }
            }
          }
        }
      }
      if (borg_temp_n == 0) {
        y._3_1_ = false;
      }
      else {
        for (b_x = L'\0'; b_x < borg_temp_n; b_x = b_x + L'\x01') {
          borg_flow_enqueue_grid((uint)borg_temp_y[b_x],(uint)borg_temp_x[b_x]);
        }
        borg_flow_spread(L'ú',true,false,false,L'\xffffffff',false);
        _Var4 = borg_flow_commit("vault excavation",L'\b');
        if (_Var4) {
          _Var4 = borg_flow_old(L'\b');
          if (_Var4) {
            y._3_1_ = true;
          }
          else {
            y._3_1_ = false;
          }
        }
        else {
          y._3_1_ = false;
        }
      }
    }
    else {
      y._3_1_ = false;
    }
  }
  else {
    y._3_1_ = false;
  }
  return y._3_1_;
}

Assistant:

bool borg_flow_vault(int nearness)
{
    int  y, x, i;
    int  b_y, b_x;
    bool can_dig_hard;

    borg_grid *ag;

    /* reset counters */
    borg_temp_n = 0;
    i           = 0;

    /* no need if no vault on level */
    if (!vault_on_level)
        return false;

    /* no need if we can't dig at least quartz */
    if (!borg_can_dig(false, FEAT_QUARTZ))
        return false;

    can_dig_hard = borg_can_dig(false, FEAT_GRANITE);

    /* build the array -- Scan screen */
    for (y = w_y; y < w_y + SCREEN_HGT; y++) {
        for (x = w_x; x < w_x + SCREEN_WID; x++) {

            /* only bother with near ones */
            if (distance(borg.c, loc(x, y)) > nearness)
                continue;

            uint8_t feat = borg_grids[y][x].feat;

            /* only deal with excavatable walls */
            if (feat != FEAT_RUBBLE
                && feat != FEAT_QUARTZ 
                && feat != FEAT_MAGMA
                && feat != FEAT_QUARTZ_K 
                && feat != FEAT_MAGMA_K) {
                /* only deal with granite if we are good diggers */
                if (!can_dig_hard || feat != FEAT_GRANITE)
                    continue;
            }

            /* Examine grids adjacent to this grid to see if there is a perma
             * wall adjacent */
            for (i = 0; i < 8; i++) {
                b_x = x + ddx_ddd[i];
                b_y = y + ddy_ddd[i];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(b_x, b_y)))
                    continue;

                /* Access the grid */
                ag = &borg_grids[b_y][b_x];

                /* Not a perma, and not our spot. */
                if (ag->feat != FEAT_PERM)
                    continue;

                /* keep count */
                borg_temp_y[borg_temp_n] = y;
                borg_temp_x[borg_temp_n] = x;
                borg_temp_n++;
            }
        }
    }

    /* None to flow to */
    if (!borg_temp_n)
        return false;

    /* Examine each ones */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("vault excavation", GOAL_VAULT))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_VAULT))
        return false;

    /* Success */
    return true;
}